

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_sigpass_mqc(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_UINT32 *pOVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  opj_mqc_state_t *poVar7;
  OPJ_BYTE *pOVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  opj_mqc_state_t **ppoVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  OPJ_UINT32 c;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  OPJ_UINT32 OVar23;
  uint *puVar24;
  OPJ_UINT32 OVar25;
  opj_flag_t *flagsp;
  uint *puVar26;
  uint uVar27;
  ulong uVar28;
  uint *local_60;
  
  uVar19 = t1->w;
  uVar28 = (ulong)uVar19;
  if ((uVar28 == 0x40) && (t1->h == 0x40)) {
    puVar26 = t1->flags + 0x43;
    uVar9 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    uVar10 = -uVar9;
    puVar24 = (uint *)t1->data;
    ppoVar13 = (t1->mqc).curctx;
    uVar19 = (t1->mqc).c;
    uVar21 = (t1->mqc).a;
    OVar25 = (t1->mqc).ct;
    uVar15 = 0;
    if ((cblksty & 8U) == 0) {
      for (; uVar15 < 0x40; uVar15 = uVar15 + 4) {
        for (iVar18 = 0; iVar18 != 0x40; iVar18 = iVar18 + 1) {
          uVar14 = *puVar26;
          uVar28 = (ulong)uVar14;
          if (uVar28 != 0) {
            if ((uVar14 & 0x1ef) != 0 && (uVar14 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00125ace;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00125ace:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_00125b4e;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00125b4e:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],0);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_00125c38;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00125c38:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_00125ccb;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_00125ccb:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar27 = OVar12 ^ bVar3;
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                *puVar24 = uVar16;
                *(byte *)(puVar26 + -1) = (byte)puVar26[-1] | 0x20;
                uVar14 = uVar27 << 0x13 | uVar14 | 0x10;
                *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 8;
                *(ulong *)(puVar26 + -0x43) =
                     CONCAT44(uVar27 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar26 + -0x43);
                *(byte *)((long)puVar26 + -0x103) = *(byte *)((long)puVar26 + -0x103) | 0x80;
              }
              uVar28 = (ulong)(uVar14 | 0x200000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0xf78) != 0 && (uVar28 & 0x1000080) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 3) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00125e1e;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00125e1e:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_00125e9e;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00125e9e:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],1);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_00125f89;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00125f89:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_0012601c;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_0012601c:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0x40] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 1;
                uVar14 = uVar14 | (OVar12 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 0x40;
              }
              uVar28 = (ulong)(uVar14 | 0x1000000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0x7bc0) != 0 && (uVar28 & 0x8000400) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 6) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_0012613b;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_0012613b:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_001261bb;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_001261bb:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],2);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_001262a6;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_001262a6:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_00126339;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_00126339:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0x80] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 8;
                uVar14 = uVar14 | (OVar12 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar26 + 5) = *(byte *)((long)puVar26 + 5) | 2;
              }
              uVar28 = (ulong)(uVar14 | 0x8000000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0x3de00) != 0 && (uVar28 & 0x40002000) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 9) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00126459;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00126459:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_001264d9;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_001264d9:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],3);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_001265c4;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_001265c4:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_00126657;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_00126657:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar27 = OVar12 ^ bVar3;
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0xc0] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 0x40;
                *(byte *)((long)puVar26 + 5) = *(byte *)((long)puVar26 + 5) | 0x10;
                uVar14 = uVar14 | uVar27 << 0x1c | 0x2000;
                *(ulong *)(puVar26 + 0x41) =
                     CONCAT44(uVar27 << 0x12,4) | 0x200000000 | *(ulong *)(puVar26 + 0x41);
                *(byte *)(puVar26 + 0x43) = (byte)puVar26[0x43] | 1;
              }
              uVar14 = uVar14 | 0x40000000;
            }
            *puVar26 = uVar14;
          }
          puVar24 = puVar24 + 1;
          puVar26 = puVar26 + 1;
        }
        puVar24 = puVar24 + 0xc0;
        puVar26 = puVar26 + 2;
      }
    }
    else {
      for (; uVar15 < 0x40; uVar15 = uVar15 + 4) {
        for (iVar18 = 0; iVar18 != 0x40; iVar18 = iVar18 + 1) {
          uVar14 = *puVar26;
          uVar28 = (ulong)uVar14;
          if (uVar28 != 0) {
            if ((uVar14 & 0x1ef) != 0 && (uVar14 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_001267fe;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_001267fe:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_00126879;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00126879:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],0);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_0012695d;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_0012695d:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_001269e6;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_001269e6:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                *puVar24 = uVar16;
                *(byte *)(puVar26 + -1) = (byte)puVar26[-1] | 0x20;
                uVar14 = (OVar12 ^ bVar3) << 0x13 | uVar14 | 0x10;
                *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 8;
              }
              uVar28 = (ulong)(uVar14 | 0x200000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0xf78) != 0 && (uVar28 & 0x1000080) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 3) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00126afd;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00126afd:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_00126b78;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00126b78:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],1);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_00126c61;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00126c61:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_00126cf4;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_00126cf4:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0x40] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 1;
                uVar14 = uVar14 | (OVar12 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 0x40;
              }
              uVar28 = (ulong)(uVar14 | 0x1000000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0x7bc0) != 0 && (uVar28 & 0x8000400) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 6) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00126e10;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00126e10:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_00126e8b;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00126e8b:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],2);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_00126f74;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00126f74:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_00127007;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_00127007:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0x80] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 8;
                uVar14 = uVar14 | (OVar12 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar26 + 5) = *(byte *)((long)puVar26 + 5) | 2;
              }
              uVar28 = (ulong)(uVar14 | 0x8000000);
            }
            uVar14 = (uint)uVar28;
            if ((uVar28 & 0x3de00) != 0 && (uVar28 & 0x40002000) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar28 >> 9) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar16 = poVar7->qeval;
              uVar27 = uVar21 - uVar16;
              if (uVar19 >> 0x10 < uVar16) {
                uVar5 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                uVar21 = uVar16;
                do {
                  if (OVar25 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x200;
                        OVar25 = 7;
                        goto LAB_00127124;
                      }
                      uVar19 = uVar19 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      uVar19 = uVar19 + (uint)bVar3 * 0x100;
                    }
                    OVar25 = 8;
                  }
LAB_00127124:
                  uVar21 = uVar21 * 2;
                  uVar19 = uVar19 * 2;
                  OVar25 = OVar25 - 1;
                } while (uVar21 < 0x8000);
                uVar20 = (uint)(uVar5 == 0);
                if (uVar27 < uVar16) {
                  uVar20 = uVar5;
                }
              }
              else {
                uVar19 = uVar19 + uVar16 * -0x10000;
                uVar21 = uVar27;
                if ((short)uVar27 < 0) {
                  uVar20 = poVar7->mps;
                }
                else {
                  uVar5 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar3 * 0x200;
                          OVar25 = 7;
                          goto LAB_0012719f;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar3 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_0012719f:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  uVar20 = (uint)(uVar5 == 0);
                  if (uVar16 <= uVar27) {
                    uVar20 = uVar5;
                  }
                }
              }
              if (uVar20 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar14,puVar26[-1],puVar26[1],3);
                bVar3 = ""[OVar11];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar7 = *ppoVar13;
                uVar16 = poVar7->qeval;
                uVar27 = uVar21 - uVar16;
                if (uVar19 >> 0x10 < uVar16) {
                  OVar11 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar16 <= uVar27];
                  uVar21 = uVar16;
                  do {
                    if (OVar25 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x200;
                          OVar25 = 7;
                          goto LAB_00127288;
                        }
                        uVar19 = uVar19 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        uVar19 = uVar19 + (uint)bVar4 * 0x100;
                      }
                      OVar25 = 8;
                    }
LAB_00127288:
                    uVar21 = uVar21 * 2;
                    uVar19 = uVar19 * 2;
                    OVar25 = OVar25 - 1;
                  } while (uVar21 < 0x8000);
                  OVar12 = (uint)(OVar11 == 0);
                  if (uVar27 < uVar16) {
                    OVar12 = OVar11;
                  }
                }
                else {
                  uVar19 = uVar19 + uVar16 * -0x10000;
                  uVar21 = uVar27;
                  if ((short)uVar27 < 0) {
                    OVar12 = poVar7->mps;
                  }
                  else {
                    OVar11 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar27 < uVar16];
                    do {
                      if (OVar25 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            uVar19 = uVar19 + (uint)bVar4 * 0x200;
                            OVar25 = 7;
                            goto LAB_0012731b;
                          }
                          uVar19 = uVar19 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          uVar19 = uVar19 + (uint)bVar4 * 0x100;
                        }
                        OVar25 = 8;
                      }
LAB_0012731b:
                      uVar21 = uVar21 * 2;
                      uVar19 = uVar19 * 2;
                      OVar25 = OVar25 - 1;
                    } while (uVar21 < 0x8000);
                    OVar12 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar27) {
                      OVar12 = OVar11;
                    }
                  }
                }
                uVar27 = OVar12 ^ bVar3;
                uVar16 = uVar10;
                if (OVar12 == bVar3) {
                  uVar16 = uVar9;
                }
                puVar24[0xc0] = uVar16;
                *(byte *)((long)puVar26 + -3) = *(byte *)((long)puVar26 + -3) | 0x40;
                *(byte *)((long)puVar26 + 5) = *(byte *)((long)puVar26 + 5) | 0x10;
                uVar14 = uVar14 | uVar27 << 0x1c | 0x2000;
                *(ulong *)(puVar26 + 0x41) =
                     CONCAT44(uVar27 << 0x12,4) | 0x200000000 | *(ulong *)(puVar26 + 0x41);
                *(byte *)(puVar26 + 0x43) = (byte)puVar26[0x43] | 1;
              }
              uVar14 = uVar14 | 0x40000000;
            }
            *puVar26 = uVar14;
          }
          puVar24 = puVar24 + 1;
          puVar26 = puVar26 + 1;
        }
        puVar24 = puVar24 + 0xc0;
        puVar26 = puVar26 + 2;
      }
    }
    (t1->mqc).curctx = ppoVar13;
    (t1->mqc).c = uVar19;
    (t1->mqc).a = uVar21;
    (t1->mqc).ct = OVar25;
  }
  else {
    puVar24 = t1->flags + (uVar19 + 3);
    uVar10 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    uVar15 = -uVar10;
    local_60 = (uint *)t1->data;
    ppoVar13 = (t1->mqc).curctx;
    OVar25 = (t1->mqc).c;
    uVar21 = (t1->mqc).a;
    OVar11 = (t1->mqc).ct;
    uVar9 = uVar19 * 3;
    if ((cblksty & 8U) == 0) {
      for (uVar14 = 0; uVar16 = t1->h, uVar14 < (uVar16 & 0xfffffffc); uVar14 = uVar14 + 4) {
        for (uVar16 = 0; OVar12 = 8, uVar16 != uVar19; uVar16 = uVar16 + 1) {
          uVar27 = *puVar24;
          uVar17 = (ulong)uVar27;
          if (uVar17 != 0) {
            if ((uVar27 & 0x1ef) != 0 && (uVar27 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],0);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_00127693;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_00127693:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_0012771c;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_0012771c:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar20 = OVar23 ^ bVar3;
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                *local_60 = uVar5;
                *(byte *)(puVar24 + -1) = (byte)puVar24[-1] | 0x20;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 8;
                uVar27 = uVar20 << 0x13 | uVar27 | 0x10;
                uVar17 = (ulong)(t1->w + 2);
                *(ulong *)(puVar24 + (-1 - uVar17)) =
                     CONCAT44(uVar20 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar24 + (-1 - uVar17));
                pbVar2 = (byte *)((long)puVar24 + uVar17 * -4 + 5);
                *pbVar2 = *pbVar2 | 0x80;
              }
              uVar17 = (ulong)(uVar27 | 0x200000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0xf78) != 0 && (uVar17 & 0x1000080) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 3) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],1);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_001279de;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_001279de:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00127a67;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00127a67:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar28] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 1;
                uVar27 = uVar27 | (OVar23 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 0x40;
              }
              uVar17 = (ulong)(uVar27 | 0x1000000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0x7bc0) != 0 && (uVar17 & 0x8000400) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 6) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],2);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_00127ceb;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_00127ceb:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00127d74;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00127d74:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar19 * 2] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 8;
                uVar27 = uVar27 | (OVar23 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 2;
              }
              uVar17 = (ulong)(uVar27 | 0x8000000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0x3de00) != 0 && (uVar17 & 0x40002000) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 9) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],3);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_00127ff9;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_00127ff9:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00128082;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00128082:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar20 = OVar23 ^ bVar3;
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar9] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 0x40;
                uVar27 = uVar27 | uVar20 << 0x1c | 0x2000;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 0x10;
                uVar17 = (ulong)(t1->w + 2);
                *(ulong *)(puVar24 + (uVar17 - 1)) =
                     CONCAT44(uVar20 << 0x12,4) | 0x200000000 | *(ulong *)(puVar24 + (uVar17 - 1));
                *(byte *)(puVar24 + uVar17 + 1) = (byte)puVar24[uVar17 + 1] | 1;
              }
              uVar27 = uVar27 | 0x40000000;
            }
            *puVar24 = uVar27;
          }
          local_60 = local_60 + 1;
          puVar24 = puVar24 + 1;
        }
        local_60 = local_60 + uVar9;
        puVar24 = puVar24 + 2;
      }
      (t1->mqc).curctx = ppoVar13;
      (t1->mqc).c = OVar25;
      (t1->mqc).a = uVar21;
      (t1->mqc).ct = OVar11;
      if (uVar14 < uVar16) {
        for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
          uVar9 = 0;
          for (uVar28 = 0; uVar28 < uVar16 - uVar14; uVar28 = uVar28 + 1) {
            opj_t1_dec_sigpass_step_mqc
                      (t1,puVar24,(OPJ_INT32 *)(local_60 + uVar9),uVar10,(OPJ_UINT32)uVar28,
                       t1->w + 2,0);
            uVar16 = t1->h;
            uVar9 = uVar9 + uVar19;
          }
          local_60 = local_60 + 1;
          puVar24 = puVar24 + 1;
        }
      }
    }
    else {
      for (uVar14 = 0; uVar16 = t1->h, uVar14 < (uVar16 & 0xfffffffc); uVar14 = uVar14 + 4) {
        for (uVar16 = 0; OVar12 = 8, uVar16 != uVar19; uVar16 = uVar16 + 1) {
          uVar27 = *puVar24;
          uVar17 = (ulong)uVar27;
          if (uVar17 != 0) {
            if ((uVar27 & 0x1ef) != 0 && (uVar27 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],0);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_001283ad;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_001283ad:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00128436;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00128436:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                *local_60 = uVar5;
                *(byte *)(puVar24 + -1) = (byte)puVar24[-1] | 0x20;
                uVar27 = (OVar23 ^ bVar3) << 0x13 | uVar27 | 0x10;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 8;
              }
              uVar17 = (ulong)(uVar27 | 0x200000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0xf78) != 0 && (uVar17 & 0x1000080) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 3) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],1);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_001286b3;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_001286b3:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_0012873c;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_0012873c:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar28] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 1;
                uVar27 = uVar27 | (OVar23 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 0x40;
              }
              uVar17 = (ulong)(uVar27 | 0x1000000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0x7bc0) != 0 && (uVar17 & 0x8000400) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 6) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],2);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_001289c0;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_001289c0:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00128a49;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00128a49:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar19 * 2] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 8;
                uVar27 = uVar27 | (OVar23 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 2;
              }
              uVar17 = (ulong)(uVar27 | 0x8000000);
            }
            OVar12 = 8;
            uVar27 = (uint)uVar17;
            if ((uVar17 & 0x3de00) != 0 && (uVar17 & 0x40002000) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar17 >> 9) & 0x1ef];
              ppoVar13 = (t1->mqc).ctxs + bVar3;
              poVar7 = (t1->mqc).ctxs[bVar3];
              uVar5 = poVar7->qeval;
              uVar20 = uVar21 - uVar5;
              if (OVar25 >> 0x10 < uVar5) {
                uVar6 = poVar7->mps;
                *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                uVar21 = uVar5;
                do {
                  if (OVar11 == 0) {
                    pOVar8 = (t1->mqc).bp;
                    bVar3 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x200;
                        OVar11 = 7;
                      }
                      else {
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                        OVar11 = OVar12;
                      }
                    }
                    else {
                      (t1->mqc).bp = pOVar8 + 1;
                      OVar25 = OVar25 + (uint)bVar3 * 0x100;
                      OVar11 = OVar12;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar25 = OVar25 * 2;
                  OVar11 = OVar11 - 1;
                } while (uVar21 < 0x8000);
                uVar22 = (uint)(uVar6 == 0);
                if (uVar20 < uVar5) {
                  uVar22 = uVar6;
                }
              }
              else {
                OVar25 = OVar25 + uVar5 * -0x10000;
                uVar21 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar22 = poVar7->mps;
                }
                else {
                  uVar6 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar3 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar3 * 0x200;
                          OVar11 = 7;
                        }
                        else {
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                          OVar11 = OVar12;
                        }
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar3 * 0x100;
                        OVar11 = OVar12;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  uVar22 = (uint)(uVar6 == 0);
                  if (uVar5 <= uVar20) {
                    uVar22 = uVar6;
                  }
                }
              }
              if (uVar22 != 0) {
                OVar12 = opj_t1_getctxtno_sc_or_spb_index(uVar27,puVar24[-1],puVar24[1],3);
                bVar3 = ""[OVar12];
                ppoVar13 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar12];
                poVar7 = *ppoVar13;
                uVar5 = poVar7->qeval;
                uVar20 = uVar21 - uVar5;
                if (OVar25 >> 0x10 < uVar5) {
                  OVar12 = poVar7->mps;
                  *ppoVar13 = (&poVar7->nmps)[uVar5 <= uVar20];
                  uVar21 = uVar5;
                  do {
                    if (OVar11 == 0) {
                      pOVar8 = (t1->mqc).bp;
                      bVar4 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x200;
                          OVar11 = 7;
                          goto LAB_00128cce;
                        }
                        OVar25 = OVar25 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar8 + 1;
                        OVar25 = OVar25 + (uint)bVar4 * 0x100;
                      }
                      OVar11 = 8;
                    }
LAB_00128cce:
                    uVar21 = uVar21 * 2;
                    OVar25 = OVar25 * 2;
                    OVar11 = OVar11 - 1;
                  } while (uVar21 < 0x8000);
                  OVar23 = (uint)(OVar12 == 0);
                  if (uVar20 < uVar5) {
                    OVar23 = OVar12;
                  }
                }
                else {
                  OVar25 = OVar25 + uVar5 * -0x10000;
                  uVar21 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar23 = poVar7->mps;
                  }
                  else {
                    OVar12 = poVar7->mps;
                    *ppoVar13 = (&poVar7->nmps)[uVar20 < uVar5];
                    do {
                      if (OVar11 == 0) {
                        pOVar8 = (t1->mqc).bp;
                        bVar4 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar8 + 1;
                            OVar25 = OVar25 + (uint)bVar4 * 0x200;
                            OVar11 = 7;
                            goto LAB_00128d57;
                          }
                          OVar25 = OVar25 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar8 + 1;
                          OVar25 = OVar25 + (uint)bVar4 * 0x100;
                        }
                        OVar11 = 8;
                      }
LAB_00128d57:
                      uVar21 = uVar21 * 2;
                      OVar25 = OVar25 * 2;
                      OVar11 = OVar11 - 1;
                    } while (uVar21 < 0x8000);
                    OVar23 = (uint)(OVar12 == 0);
                    if (uVar5 <= uVar20) {
                      OVar23 = OVar12;
                    }
                  }
                }
                uVar20 = OVar23 ^ bVar3;
                uVar5 = uVar15;
                if (OVar23 == bVar3) {
                  uVar5 = uVar10;
                }
                local_60[uVar9] = uVar5;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 0x40;
                uVar27 = uVar27 | uVar20 << 0x1c | 0x2000;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 0x10;
                uVar17 = (ulong)(t1->w + 2);
                *(ulong *)(puVar24 + (uVar17 - 1)) =
                     CONCAT44(uVar20 << 0x12,4) | 0x200000000 | *(ulong *)(puVar24 + (uVar17 - 1));
                *(byte *)(puVar24 + uVar17 + 1) = (byte)puVar24[uVar17 + 1] | 1;
              }
              uVar27 = uVar27 | 0x40000000;
            }
            *puVar24 = uVar27;
          }
          local_60 = local_60 + 1;
          puVar24 = puVar24 + 1;
        }
        local_60 = local_60 + uVar9;
        puVar24 = puVar24 + 2;
      }
      (t1->mqc).curctx = ppoVar13;
      (t1->mqc).c = OVar25;
      (t1->mqc).a = uVar21;
      (t1->mqc).ct = OVar11;
      if (uVar14 < uVar16) {
        for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
          uVar9 = 0;
          for (uVar28 = 0; uVar28 < uVar16 - uVar14; uVar28 = uVar28 + 1) {
            opj_t1_dec_sigpass_step_mqc
                      (t1,puVar24,(OPJ_INT32 *)(local_60 + uVar9),uVar10,(OPJ_UINT32)uVar28,
                       t1->w + 2,1);
            uVar16 = t1->h;
            uVar9 = uVar9 + uVar19;
          }
          local_60 = local_60 + 1;
          puVar24 = puVar24 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_sigpass_mqc(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_generic_novsc(t1, bpno);
        }
    }
}